

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *p,Gia_Obj_t *pObj1,Gia_Obj_t *pObj2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar4;
  abctime aVar5;
  abctime clk2;
  abctime clk;
  int nConflicts;
  int status;
  int RetValue;
  int Lits [2];
  int nBTLimit;
  Gia_Obj_t *pObjR2;
  Gia_Obj_t *pObjR1;
  Gia_Obj_t *pObj2_local;
  Gia_Obj_t *pObj1_local;
  Cec_ManSat_t *p_local;
  
  pObj = Gia_Regular(pObj1);
  register0x00000000 = Gia_Regular(pObj2);
  Lits[0] = p->pPars->nBTLimit;
  pGVar4 = Gia_ManConst0(p->pAig);
  if (((pObj1 == pGVar4) || (pGVar4 = Gia_ManConst0(p->pAig), pObj2 == pGVar4)) ||
     (pGVar4 = Gia_Not(pObj2), pObj1 == pGVar4)) {
    p_local._4_4_ = 1;
  }
  else {
    pGVar4 = Gia_ManConst1(p->pAig);
    if ((pObj1 == pGVar4) &&
       ((pObj2 == (Gia_Obj_t *)0x0 || (pGVar4 = Gia_ManConst1(p->pAig), pObj2 == pGVar4)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                    ,0x245,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    p->nCallsSince = p->nCallsSince + 1;
    p->nSatTotal = p->nSatTotal + 1;
    if ((p->pSat == (sat_solver *)0x0) ||
       (((p->pPars->nSatVarMax != 0 && (p->pPars->nSatVarMax < p->nSatVars)) &&
        (p->pPars->nCallsRecycle < p->nCallsSince)))) {
      Cec_ManSatSolverRecycle(p);
    }
    Abc_Clock();
    Cec_CnfNodeAddToSolver(p,pObj);
    Cec_CnfNodeAddToSolver(p,stack0xffffffffffffffc8);
    Abc_Clock();
    if (p->pSat->qtail != p->pSat->qhead) {
      iVar1 = sat_solver_simplify(p->pSat);
      if (iVar1 == 0) {
        __assert_fail("status != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x263,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)")
        ;
      }
      if (p->pSat->qtail != p->pSat->qhead) {
        __assert_fail("p->pSat->qtail == p->pSat->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x264,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)")
        ;
      }
    }
    iVar1 = Cec_ObjSatNum(p,pObj);
    iVar2 = Gia_IsComplement(pObj1);
    status = toLitCond(iVar1,iVar2);
    iVar1 = Cec_ObjSatNum(p,stack0xffffffffffffffc8);
    iVar2 = Gia_IsComplement(pObj2);
    RetValue = toLitCond(iVar1,iVar2);
    if (p->pPars->fPolarFlip != 0) {
      if (*(long *)pObj < 0) {
        status = lit_neg(status);
      }
      if (*(long *)stack0xffffffffffffffc8 < 0) {
        RetValue = lit_neg(RetValue);
      }
    }
    aVar5 = Abc_Clock();
    iVar2 = (int)(p->pSat->stats).conflicts;
    Abc_Clock();
    iVar3 = sat_solver_solve(p->pSat,&status,Lits,(long)Lits[0],0,0,0);
    iVar1 = (int)aVar5;
    if (iVar3 == -1) {
      aVar5 = Abc_Clock();
      p->timeSatUnsat = p->timeSatUnsat + ((int)aVar5 - iVar1);
      status = lit_neg(status);
      RetValue = lit_neg(RetValue);
      iVar1 = sat_solver_addclause(p->pSat,&status,Lits);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x27f,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)")
        ;
      }
      p->nSatUnsat = p->nSatUnsat + 1;
      p->nConfUnsat = p->nConfUnsat + ((int)(p->pSat->stats).conflicts - iVar2);
      p_local._4_4_ = 1;
    }
    else if (iVar3 == 1) {
      aVar5 = Abc_Clock();
      p->timeSatSat = p->timeSatSat + ((int)aVar5 - iVar1);
      p->nSatSat = p->nSatSat + 1;
      p->nConfSat = p->nConfSat + ((int)(p->pSat->stats).conflicts - iVar2);
      p_local._4_4_ = 0;
    }
    else {
      aVar5 = Abc_Clock();
      p->timeSatUndec = p->timeSatUndec + ((int)aVar5 - iVar1);
      p->nSatUndec = p->nSatUndec + 1;
      p->nConfUndec = p->nConfUndec + ((int)(p->pSat->stats).conflicts - iVar2);
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cec_ManSatCheckNodeTwo( Cec_ManSat_t * p, Gia_Obj_t * pObj1, Gia_Obj_t * pObj2 )
{
    Gia_Obj_t * pObjR1 = Gia_Regular(pObj1);
    Gia_Obj_t * pObjR2 = Gia_Regular(pObj2);
    int nBTLimit = p->pPars->nBTLimit;
    int Lits[2], RetValue, status, nConflicts;
    abctime clk, clk2;

    if ( pObj1 == Gia_ManConst0(p->pAig) || pObj2 == Gia_ManConst0(p->pAig) || pObj1 == Gia_Not(pObj2) )
        return 1;
    if ( pObj1 == Gia_ManConst1(p->pAig) && (pObj2 == NULL || pObj2 == Gia_ManConst1(p->pAig)) )
    {
        assert( 0 );
        return 0;
    }

    p->nCallsSince++;  // experiment with this!!!
    p->nSatTotal++;
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Cec_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
clk2 = Abc_Clock();
    Cec_CnfNodeAddToSolver( p, pObjR1 );
    Cec_CnfNodeAddToSolver( p, pObjR2 );
//ABC_PRT( "cnf", Abc_Clock() - clk2 );
//Abc_Print( 1, "%d \n", p->pSat->size );

clk2 = Abc_Clock();
//    Cec_SetActivityFactors( p, pObjR1 ); 
//    Cec_SetActivityFactors( p, pObjR2 ); 
//ABC_PRT( "act", Abc_Clock() - clk2 );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Lits[0] = toLitCond( Cec_ObjSatNum(p,pObjR1), Gia_IsComplement(pObj1) );
    Lits[1] = toLitCond( Cec_ObjSatNum(p,pObjR2), Gia_IsComplement(pObj2) );
    if ( p->pPars->fPolarFlip )
    {
        if ( pObjR1->fPhase )  Lits[0] = lit_neg( Lits[0] );
        if ( pObjR2->fPhase )  Lits[1] = lit_neg( Lits[1] );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    nConflicts = p->pSat->stats.conflicts;

clk2 = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, Lits, Lits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//ABC_PRT( "sat", Abc_Clock() - clk2 );

    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        Lits[0] = lit_neg( Lits[0] );
        Lits[1] = lit_neg( Lits[1] );
        RetValue = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
        assert( RetValue );
        p->nSatUnsat++;
        p->nConfUnsat += p->pSat->stats.conflicts - nConflicts;       
//Abc_Print( 1, "UNSAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatSat++;
        p->nConfSat += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "SAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 0;
    }
    else // if ( RetValue == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatUndec++;
        p->nConfUndec += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "UNDEC after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return -1;
    }
}